

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

int __thiscall
MlmWrap::sendMessage
          (MlmWrap *this,char *address,char *subject,TrodesMsg *tmsg,char *tracker,uint32_t timeout)

{
  int iVar1;
  zmsg_t *pzVar2;
  zmsg_t *zmsg;
  string local_50;
  
  TrodesMsg::getformat_abi_cxx11_(&local_50,tmsg);
  pzVar2 = TrodesMsg::getzmsg(tmsg);
  pzVar2 = czhelp_zmsg_create("ssss4sm","MSG",address,subject,tracker,(ulong)timeout,
                              local_50._M_dataplus._M_p,pzVar2);
  std::__cxx11::string::~string((string *)&local_50);
  zmsg = pzVar2;
  std::mutex::lock(&this->actormutex);
  iVar1 = zactor_send(this->actor,&zmsg);
  pthread_mutex_unlock((pthread_mutex_t *)&this->actormutex);
  return iVar1;
}

Assistant:

int MlmWrap::sendMessage(const char *address, const char *subject, TrodesMsg &tmsg, const char *tracker, uint32_t timeout){
    int rc = -1;
    zmsg_t *zmsg = czhelp_zmsg_create("ssss4sm", mailboxmsg, address, subject, tracker,
                                       timeout, tmsg.getformat().c_str(), tmsg.getzmsg());
    std::lock_guard<std::mutex> lock(actormutex);
    rc = zactor_send(actor, &zmsg);
    return rc;
}